

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O3

void feature_set_matching(Ptr *image1,Ptr *image2)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer set_2;
  undefined1 auVar3 [8];
  undefined1 set_1 [8];
  _Alloc_hider _Var4;
  int iVar5;
  long *plVar6;
  pointer pDVar7;
  ostream *poVar8;
  pointer pDVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  FeatureSet local_378;
  FeatureSet local_2e0;
  undefined1 auStack_248 [8];
  Result sift_matching;
  Result surf_matching;
  Result matching;
  AlignedMemory<math::Vec128f,_16> sift_descr1;
  undefined1 auStack_198 [8];
  AlignedMemory<math::Vec64f,_16> surf_descr1;
  undefined1 auStack_168 [8];
  AlignedMemory<math::Vec128f,_16> sift_descr2;
  undefined1 auStack_148 [8];
  AlignedMemory<math::Vec64f,_16> surf_descr2;
  Ptr local_120;
  ConstPtr local_110;
  ConstPtr local_100;
  undefined1 local_f0 [8];
  Ptr match_image;
  undefined1 local_d0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined1 local_b0 [8];
  Options sift_matching_opts;
  Options surf_matching_opts;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features1;
  undefined1 auStack_78 [8];
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features2;
  undefined1 auStack_58 [8];
  string output_filename;
  
  local_378.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.opts.feature_types = FEATURE_SIFT;
  local_378.opts.sift_opts.num_samples_per_octave = 3;
  local_378.opts.sift_opts.min_octave = 0;
  local_378.opts.sift_opts.max_octave = 4;
  local_378.opts.sift_opts.contrast_threshold = -1.0;
  local_378.opts.sift_opts.edge_ratio_threshold = 10.0;
  local_378.opts.sift_opts.base_blur_sigma = 1.6;
  local_378.opts.sift_opts.inherent_blur_sigma = 0.5;
  local_378.opts.sift_opts.verbose_output = true;
  local_378.opts.sift_opts.debug_output = false;
  local_378.opts.surf_opts.contrast_threshold = 500.0;
  local_378.opts.surf_opts.use_upright_descriptor = false;
  local_378.opts.surf_opts.verbose_output = false;
  local_378.opts.surf_opts.debug_output = false;
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr;
  p_Var2 = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  sfm::FeatureSet::compute_features
            (&local_378,
             (Ptr *)&surf_descr2.
                     super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  local_2e0.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e0.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e0.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e0.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e0.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e0.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e0.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e0.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e0.opts.feature_types = FEATURE_SIFT;
  local_2e0.opts.sift_opts.num_samples_per_octave = 3;
  local_2e0.opts.sift_opts.min_octave = 0;
  local_2e0.opts.sift_opts.max_octave = 4;
  local_2e0.opts.sift_opts.contrast_threshold = -1.0;
  local_2e0.opts.sift_opts.edge_ratio_threshold = 10.0;
  local_2e0.opts.sift_opts.base_blur_sigma = 1.6;
  local_2e0.opts.sift_opts.inherent_blur_sigma = 0.5;
  local_2e0.opts.sift_opts.verbose_output = true;
  local_2e0.opts.sift_opts.debug_output = false;
  local_2e0.opts.surf_opts.contrast_threshold = 500.0;
  local_2e0.opts.surf_opts.use_upright_descriptor = false;
  local_2e0.opts.surf_opts.verbose_output = false;
  local_2e0.opts.surf_opts.debug_output = false;
  local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  sfm::FeatureSet::compute_features(&local_2e0,&local_120);
  if (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_b0._4_4_ = 0.8;
  sift_matching_opts.descriptor_length = 0x7f7fffff;
  local_b0._0_4_ = 0x80;
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  sift_descr2.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_168 = (undefined1  [8])0x0;
  sift_descr2.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  convert_sift_descriptors<float>
            (&local_378.sift_descriptors,
             (AlignedMemory<math::Vector<float,_128>_> *)
             &matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  convert_sift_descriptors<float>
            (&local_2e0.sift_descriptors,(AlignedMemory<math::Vector<float,_128>_> *)auStack_168);
  auVar3 = auStack_168;
  set_2 = matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_248 = (undefined1  [8])0x0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar10 = (int)((ulong)-(long)matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage >> 9);
  iVar5 = (int)((ulong)((long)sift_descr2.
                              super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_168) >> 9);
  features::Matching::oneway_match<float>
            ((Options *)local_b0,
             (float *)matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,iVar10,(float *)auStack_168,iVar5,
             (vector<int,_std::allocator<int>_> *)auStack_248);
  features::Matching::oneway_match<float>
            ((Options *)local_b0,(float *)auVar3,iVar5,(float *)set_2,iVar10,
             (vector<int,_std::allocator<int>_> *)
             &sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::remove_inconsistent_matches((Result *)auStack_248);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Consistent Sift Matches: ",0x19);
  iVar5 = features::Matching::count_consistent_matches((Result *)auStack_248);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  stack0xffffffffffffff60 = 0x7f7fffff3f333333;
  sift_matching_opts.lowe_ratio_threshold = 8.96831e-44;
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_198 = (undefined1  [8])0x0;
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_148 = (undefined1  [8])0x0;
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  convert_surf_descriptors<float>
            (&local_378.surf_descriptors,(AlignedMemory<math::Vector<float,_64>_> *)auStack_198);
  convert_surf_descriptors<float>
            (&local_2e0.surf_descriptors,(AlignedMemory<math::Vector<float,_64>_> *)auStack_148);
  set_1 = auStack_148;
  auVar3 = auStack_198;
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar10 = (int)((ulong)((long)surf_descr1.
                               super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_198) >> 8);
  iVar5 = (int)((ulong)((long)surf_descr2.
                              super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148) >> 8);
  features::Matching::oneway_match<float>
            ((Options *)&sift_matching_opts.lowe_ratio_threshold,(float *)auStack_198,iVar10,
             (float *)auStack_148,iVar5,
             (vector<int,_std::allocator<int>_> *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::oneway_match<float>
            ((Options *)&sift_matching_opts.lowe_ratio_threshold,(float *)set_1,iVar5,
             (float *)auVar3,iVar10,
             (vector<int,_std::allocator<int>_> *)
             &surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::remove_inconsistent_matches
            ((Result *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Consistent Surf Matches: ",0x19);
  iVar5 = features::Matching::count_consistent_matches
                    ((Result *)
                     &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  features::Matching::combine_results
            ((Result *)auStack_248,
             (Result *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Result *)
             &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Consistent Matches: ",0x14);
  iVar5 = features::Matching::count_consistent_matches
                    ((Result *)
                     &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  surf_matching_opts.lowe_ratio_threshold = 0.0;
  surf_matching_opts.distance_threshold = 0.0;
  features1.
  super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_378.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_378.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar11 = 3;
    uVar12 = 0;
    pDVar7 = local_378.sift_descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar9 = local_378.sift_descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar12] != -1) {
        output_filename._M_dataplus._M_p._4_4_ = (pDVar7->data).v[lVar11 + -4];
        output_filename._M_dataplus._M_p._0_4_ = (pDVar7->data).v[lVar11 + -5] * 3.0;
        auStack_58._0_4_ = (pDVar7->data).v[lVar11 + -7];
        auStack_58._4_4_ = (pDVar7->data).v[lVar11 + -6];
        if (features1.
            super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<features::Visualizer::Keypoint,std::allocator<features::Visualizer::Keypoint>>
          ::_M_realloc_insert<features::Visualizer::Keypoint_const&>
                    ((vector<features::Visualizer::Keypoint,std::allocator<features::Visualizer::Keypoint>>
                      *)&surf_matching_opts.lowe_ratio_threshold,(iterator)0x0,
                     (Keypoint *)auStack_58);
          pDVar7 = local_378.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar9 = local_378.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (features1.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->x = (float)auStack_58._0_4_;
          (features1.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->y = (float)auStack_58._4_4_;
          (features1.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->radius =
               output_filename._M_dataplus._M_p._0_4_;
          (features1.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->orientation =
               output_filename._M_dataplus._M_p._4_4_;
          features1.
          super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
          ._M_impl.super__Vector_impl_data._M_start =
               features1.
               super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          pDVar7 = local_378.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar9 = local_378.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x84;
    } while (uVar12 < (ulong)(((long)pDVar9 - (long)pDVar7 >> 4) * 0xf83e0f83e0f83e1));
  }
  auStack_78 = (undefined1  [8])0x0;
  features2.
  super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  features2.
  super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_2e0.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2e0.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar11 = 3;
    uVar12 = 0;
    pDVar7 = local_2e0.sift_descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar9 = local_2e0.sift_descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar12] != -1) {
        output_filename._M_dataplus._M_p._4_4_ = (pDVar7->data).v[lVar11 + -4];
        output_filename._M_dataplus._M_p._0_4_ = (pDVar7->data).v[lVar11 + -5] * 3.0;
        auStack_58._0_4_ = (pDVar7->data).v[lVar11 + -7];
        auStack_58._4_4_ = (pDVar7->data).v[lVar11 + -6];
        if (features2.
            super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            features2.
            super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<features::Visualizer::Keypoint,std::allocator<features::Visualizer::Keypoint>>
          ::_M_realloc_insert<features::Visualizer::Keypoint_const&>
                    ((vector<features::Visualizer::Keypoint,std::allocator<features::Visualizer::Keypoint>>
                      *)auStack_78,
                     (iterator)
                     features2.
                     super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Keypoint *)auStack_58);
          pDVar7 = local_2e0.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar9 = local_2e0.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (features2.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->x = (float)auStack_58._0_4_;
          (features2.
           super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
           ._M_impl.super__Vector_impl_data._M_start)->y = (float)auStack_58._4_4_;
          *(pointer *)
           &(features2.
             super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
             ._M_impl.super__Vector_impl_data._M_start)->radius = output_filename._M_dataplus._M_p;
          features2.
          super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
          ._M_impl.super__Vector_impl_data._M_start =
               features2.
               super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          pDVar7 = local_2e0.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pDVar9 = local_2e0.sift_descriptors.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x84;
    } while (uVar12 < (ulong)(((long)pDVar9 - (long)pDVar7 >> 4) * 0xf83e0f83e0f83e1));
  }
  local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_110.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  features::Visualizer::draw_keypoints
            ((Visualizer *)auStack_58,&local_110,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)&surf_matching_opts.lowe_ratio_threshold,RADIUS_BOX_ORIENTATION);
  _Var4 = output_filename._M_dataplus;
  auVar3 = auStack_58;
  auStack_58 = (undefined1  [8])0x0;
  output_filename._M_dataplus._M_p = (pointer)0x0;
  p_Var2 = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)auVar3;
  (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     output_filename._M_dataplus._M_p != (pointer)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)output_filename._M_dataplus._M_p);
  }
  if (local_110.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_100.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_100.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  features::Visualizer::draw_keypoints
            ((Visualizer *)auStack_58,&local_100,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)auStack_78,RADIUS_BOX_ORIENTATION);
  _Var4 = output_filename._M_dataplus;
  auVar3 = auStack_58;
  auStack_58 = (undefined1  [8])0x0;
  output_filename._M_dataplus._M_p = (pointer)0x0;
  p_Var2 = (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)auVar3;
  (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     output_filename._M_dataplus._M_p != (pointer)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)output_filename._M_dataplus._M_p);
  }
  if (local_100.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_d0._0_8_ =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0._8_8_ =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_)->_M_use_count + 1;
    }
  }
  visualize_matching((Result *)local_f0,
                     (Ptr *)&surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Ptr *)&match_image.
                             super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                     (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                     local_d0,&local_378.positions);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  auStack_58 = (undefined1  [8])&output_filename._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_58,"./tmp/matching_featureset.png","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Saving visualization to ",0x18);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)auStack_58,
                      (long)output_filename._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_d0._16_8_ = local_f0;
  local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  if (match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = &((match_image.
                  super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    else {
      piVar1 = &((match_image.
                  super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
      *piVar1 = *piVar1 + 1;
    }
  }
  core::image::save_file((Ptr *)(local_d0 + 0x10),(string *)auStack_58);
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (auStack_58 != (undefined1  [8])&output_filename._M_string_length) {
    operator_delete((void *)auStack_58);
  }
  if (match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               match_image.
               super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78);
  }
  if (surf_matching_opts._4_8_ != 0) {
    operator_delete((void *)surf_matching_opts._4_8_);
  }
  if (matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (auStack_148 != (undefined1  [8])0x0) {
    free((void *)auStack_148);
  }
  if (auStack_198 != (undefined1  [8])0x0) {
    free((void *)auStack_198);
  }
  if (sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (auStack_248 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_248);
  }
  if (auStack_168 != (undefined1  [8])0x0) {
    free((void *)auStack_168);
  }
  if (matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    free(matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage);
  }
  if (local_2e0.surf_descriptors.
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.surf_descriptors.
                    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.sift_descriptors.
                    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.colors.
      super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.colors.
                    super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.positions.
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.positions.
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378.surf_descriptors.
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.surf_descriptors.
                    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378.sift_descriptors.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.sift_descriptors.
                    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378.colors.
      super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.colors.
                    super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378.positions.
      super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.positions.
                    super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
feature_set_matching (core::ByteImage::Ptr image1, core::ByteImage::Ptr image2)
{
    /*FeatureSet 计算并存储一个视角的特征点，包含SIFT和SURF特征点 */
    sfm::FeatureSet::Options feature_set_opts;
    //feature_types设置为FEATURE_ALL表示检测SIFT和SURF两种特征点进行匹配
    feature_set_opts.feature_types = sfm::FeatureSet::FEATURE_SIFT;
    feature_set_opts.sift_opts.verbose_output = true;
    //feature_set_opts.surf_opts.verbose_output = true;
    //feature_set_opts.surf_opts.contrast_threshold = 500.0f;

    // 计算第一幅图像的SIT和SURF特征点
    sfm::FeatureSet feat1(feature_set_opts);
    feat1.compute_features(image1);
    // 计算第二幅图像的SIFT和SURF特征点
    sfm::FeatureSet feat2(feature_set_opts);
    feat2.compute_features(image2);

    /* 对sift特征描述子进行匹配 */
    // sift 特征描述子匹配参数
    sfm::Matching::Options sift_matching_opts;
    sift_matching_opts.lowe_ratio_threshold = 0.8f;
    sift_matching_opts.descriptor_length = 128;
    sift_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec128us, 16> sift_descr1, sift_descr2;
#else
    util::AlignedMemory<math::Vec128f, 16> sift_descr1, sift_descr2;
#endif
    // 将描述子转成特定的内存格式
    convert_sift_descriptors(feat1.sift_descriptors, &sift_descr1);
    convert_sift_descriptors(feat2.sift_descriptors, &sift_descr2);

    // 进行双向匹配
    sfm::Matching::Result sift_matching;
    sfm::Matching::twoway_match(sift_matching_opts,
        sift_descr1.data()->begin(), sift_descr1.size(),
        sift_descr2.data()->begin(), sift_descr2.size(),
        &sift_matching);

    // 去除不一致的匹配对，匹配对feature1和feature2是一致的需要满足，feature1的最近邻居
    // 是feature2，feature2的最近邻是feature1
    sfm::Matching::remove_inconsistent_matches(&sift_matching);
    std::cout << "Consistent Sift Matches: "
        << sfm::Matching::count_consistent_matches(sift_matching)
        << std::endl;


    /*  对surf特征描述子进行匹配  */
    // surf特征匹配参数
    sfm::Matching::Options surf_matching_opts;
    // 最近邻和次近邻的比
    surf_matching_opts.lowe_ratio_threshold = 0.7f;
    // 特征描述子的维度
    surf_matching_opts.descriptor_length = 64;
    surf_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec64s, 16> surf_descr1, surf_descr2;
#else
    util::AlignedMemory<math::Vec64f, 16> surf_descr1, surf_descr2;
#endif
    // 将描述子转化成特殊的格式
    convert_surf_descriptors(feat1.surf_descriptors, &surf_descr1);
    convert_surf_descriptors(feat2.surf_descriptors, &surf_descr2);

    // 进行surf描述子的双向匹配
    sfm::Matching::Result surf_matching;
    sfm::Matching::twoway_match(surf_matching_opts,
        surf_descr1.data()->begin(), surf_descr1.size(),
        surf_descr2.data()->begin(), surf_descr2.size(),
        &surf_matching);
    // 去除不一致的匹配对，匹配对feature 1 和 feature 2 互为最近邻
    sfm::Matching::remove_inconsistent_matches(&surf_matching);
    std::cout << "Consistent Surf Matches: "
        << sfm::Matching::count_consistent_matches(surf_matching)
        << std::endl;

    // 对sift匹配的结果和surf匹配的结果进行融合
    sfm::Matching::Result matching;
    sfm::Matching::combine_results(sift_matching, surf_matching, &matching);

    std::cout << "Consistent Matches: "
        << sfm::Matching::count_consistent_matches(matching)
        << std::endl;

    /* 特征匹配可视化 */
    /* Draw features. */
    std::vector<sfm::Visualizer::Keypoint> features1;
    for (std::size_t i = 0; i < feat1.sift_descriptors.size(); ++i)
    {
        if (matching.matches_1_2[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat1.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features1.push_back(kp);
    }

    std::vector<sfm::Visualizer::Keypoint> features2;
    for (std::size_t i = 0; i < feat2.sift_descriptors.size(); ++i)
    {
        if (matching.matches_2_1[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat2.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features2.push_back(kp);
    }

    image1 = sfm::Visualizer::draw_keypoints(image1,
        features1, sfm::Visualizer::RADIUS_BOX_ORIENTATION);
    image2 = sfm::Visualizer::draw_keypoints(image2,
        features2, sfm::Visualizer::RADIUS_BOX_ORIENTATION);

    core::ByteImage::Ptr match_image = visualize_matching(
        matching, image1, image2, feat1.positions, feat2.positions);
    std::string output_filename = "./tmp/matching_featureset.png";
    std::cout << "Saving visualization to " << output_filename << std::endl;
    core::image::save_file(match_image, output_filename);
}